

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O2

ssl_open_record_t
bssl::dtls1_open_change_cipher_spec
          (SSL *ssl,size_t *out_consumed,uint8_t *out_alert,Span<unsigned_char> in)

{
  ssl_open_record_t sVar1;
  DTLS1_STATE *pDVar2;
  ushort uVar3;
  size_t in_R9;
  bool bVar4;
  Span<unsigned_char> in_00;
  
  in_00.data_ = (uchar *)in.size_;
  pDVar2 = ssl->d1;
  uVar3 = *(ushort *)pDVar2;
  if ((uVar3 & 1) == 0) {
    in_00.size_ = in_R9;
    sVar1 = dtls1_open_handshake((bssl *)ssl,(SSL *)out_consumed,(size_t *)out_alert,in.data_,in_00)
    ;
    if (sVar1 != ssl_open_record_success) {
      return sVar1;
    }
    pDVar2 = ssl->d1;
    uVar3 = *(ushort *)pDVar2;
  }
  bVar4 = (uVar3 & 1) == 0;
  if (!bVar4) {
    *(ushort *)pDVar2 = uVar3 & 0xfffe;
  }
  return (uint)bVar4;
}

Assistant:

ssl_open_record_t dtls1_open_change_cipher_spec(SSL *ssl, size_t *out_consumed,
                                                uint8_t *out_alert,
                                                Span<uint8_t> in) {
  if (!ssl->d1->has_change_cipher_spec) {
    // dtls1_open_handshake processes both handshake and ChangeCipherSpec.
    auto ret = dtls1_open_handshake(ssl, out_consumed, out_alert, in);
    if (ret != ssl_open_record_success) {
      return ret;
    }
  }
  if (ssl->d1->has_change_cipher_spec) {
    ssl->d1->has_change_cipher_spec = false;
    return ssl_open_record_success;
  }
  return ssl_open_record_discard;
}